

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_cas2_32(void)

{
  uint address;
  uint address_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  uint res2;
  uint dest2;
  uint ea2;
  uint *compare2;
  uint res1;
  uint dest1;
  uint ea1;
  uint *compare1;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    uVar1 = m68ki_read_imm_32();
    puVar5 = m68ki_cpu.dar + (uVar1 >> 0x10 & 7);
    address = m68ki_cpu.dar[uVar1 >> 0x1c];
    uVar2 = m68ki_read_32_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
    uVar3 = uVar2 - *puVar5;
    puVar6 = m68ki_cpu.dar + (uVar1 & 7);
    address_00 = m68ki_cpu.dar[uVar1 >> 0xc & 0xf];
    uVar4 = m68ki_read_32_fc(address_00,m68ki_cpu.s_flag | m68ki_address_space);
    m68ki_cpu.n_flag = uVar3 >> 0x18;
    m68ki_cpu.v_flag = ((*puVar5 ^ uVar2) & (uVar3 ^ uVar2)) >> 0x18;
    m68ki_cpu.c_flag = (*puVar5 & uVar3 | (uVar2 ^ 0xffffffff) & (*puVar5 | uVar3)) >> 0x17;
    m68ki_cpu.not_z_flag = uVar3;
    if (uVar3 == 0) {
      m68ki_cpu.not_z_flag = uVar4 - *puVar6;
      m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
      m68ki_cpu.v_flag = ((*puVar6 ^ uVar4) & (m68ki_cpu.not_z_flag ^ uVar4)) >> 0x18;
      m68ki_cpu.c_flag =
           (*puVar6 & m68ki_cpu.not_z_flag | (uVar4 ^ 0xffffffff) & (*puVar6 | m68ki_cpu.not_z_flag)
           ) >> 0x17;
      if (m68ki_cpu.not_z_flag == 0) {
        m68ki_remaining_cycles = m68ki_remaining_cycles + -3;
        m68ki_write_32_fc(address,m68ki_cpu.s_flag | 1,m68ki_cpu.dar[uVar1 >> 0x16 & 7]);
        m68ki_write_32_fc(address_00,m68ki_cpu.s_flag | 1,m68ki_cpu.dar[uVar1 >> 6 & 7]);
        return;
      }
    }
    *puVar5 = uVar2;
    *puVar6 = uVar4;
  }
  return;
}

Assistant:

static void m68k_op_cas2_32(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_32();
		uint* compare1 = &REG_D[(word2 >> 16) & 7];
		uint ea1 = REG_DA[(word2 >> 28) & 15];
		uint dest1 = m68ki_read_32(ea1);
		uint res1 = dest1 - *compare1;
		uint* compare2 = &REG_D[word2 & 7];
		uint ea2 = REG_DA[(word2 >> 12) & 15];
		uint dest2 = m68ki_read_32(ea2);
		uint res2;

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		FLAG_N = NFLAG_32(res1);
		FLAG_Z = MASK_OUT_ABOVE_32(res1);
		FLAG_V = VFLAG_SUB_32(*compare1, dest1, res1);
		FLAG_C = CFLAG_SUB_32(*compare1, dest1, res1);

		if(COND_EQ())
		{
			res2 = dest2 - *compare2;

			FLAG_N = NFLAG_32(res2);
			FLAG_Z = MASK_OUT_ABOVE_32(res2);
			FLAG_V = VFLAG_SUB_32(*compare2, dest2, res2);
			FLAG_C = CFLAG_SUB_32(*compare2, dest2, res2);

			if(COND_EQ())
			{
				USE_CYCLES(3);
				m68ki_write_32(ea1, REG_D[(word2 >> 22) & 7]);
				m68ki_write_32(ea2, REG_D[(word2 >> 6) & 7]);
				return;
			}
		}
		*compare1 = dest1;
		*compare2 = dest2;
		return;
	}
	m68ki_exception_illegal();
}